

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::DebugExpression<kj::String>::~DebugExpression(DebugExpression<kj::String> *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pcVar1 = (this->value).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->value).content.size_;
    pAVar3 = (this->value).content.disposer;
    (this->value).content.ptr = (char *)0x0;
    (this->value).content.size_ = 0;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

DebugExpression(T&& value): value(kj::fwd<T>(value)) {}